

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

void llvm::sys::path::native(Twine *path,SmallVectorImpl<char> *result,Style style)

{
  StringRef SVar1;
  
  if ((path->RHSKind == EmptyKind) && ((path->LHSKind - 3 < 4 || (path->LHSKind == EmptyKind)))) {
    SVar1 = Twine::getSingleStringRef(path);
    if (SVar1.Data ==
        (char *)(result->super_SmallVectorTemplateBase<char,_true>).
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX) {
      __assert_fail("(!path.isSingleStringRef() || path.getSingleStringRef().data() != result.data()) && \"path and result are not allowed to overlap!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Path.cpp"
                    ,0x21d,
                    "void llvm::sys::path::native(const Twine &, SmallVectorImpl<char> &, Style)");
    }
  }
  (result->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  Twine::toVector(path,result);
  native(result,style);
  return;
}

Assistant:

void native(const Twine &path, SmallVectorImpl<char> &result, Style style) {
  assert((!path.isSingleStringRef() ||
          path.getSingleStringRef().data() != result.data()) &&
         "path and result are not allowed to overlap!");
  // Clear result.
  result.clear();
  path.toVector(result);
  native(result, style);
}